

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

BinaryExpr<const_int_&,_const_type_safe::basic_optional<type_safe::direct_optional_storage<int>_>_&>
* __thiscall
Catch::ExprLhs<int_const&>::operator!=
          (BinaryExpr<const_int_&,_const_type_safe::basic_optional<type_safe::direct_optional_storage<int>_>_&>
           *__return_storage_ptr__,ExprLhs<int_const&> *this,
          basic_optional<type_safe::direct_optional_storage<int>_> *rhs)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  StringRef local_38;
  
  bVar3 = true;
  if ((rhs->super_optional_storage<type_safe::direct_optional_storage<int>_>).storage.empty_ ==
      false) {
    iVar1 = **(int **)this;
    piVar2 = type_safe::basic_optional<type_safe::direct_optional_storage<int>_>::value(rhs);
    bVar3 = iVar1 != *piVar2;
  }
  piVar2 = *(int **)this;
  StringRef::StringRef(&local_38,"!=");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = bVar3;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_0022feb0;
  __return_storage_ptr__->m_lhs = piVar2;
  (__return_storage_ptr__->m_op).m_start = local_38.m_start;
  (__return_storage_ptr__->m_op).m_size = local_38.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator != ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareNotEqual( m_lhs, rhs ), m_lhs, "!=", rhs };
        }